

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>
               *this,int i)

{
  value_type vVar1;
  double dVar2;
  value_type vVar3;
  double dVar4;
  
  vVar1 = FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>::fastAccessDx
                    (&this->left_->fadexpr_,i);
  dVar2 = sin((this->right_->fadexpr_).expr_.fadexpr_.left_.constant_ *
              ((this->right_->fadexpr_).expr_.fadexpr_.right_)->val_);
  vVar3 = FadFuncSin<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>::fastAccessDx
                    (&this->right_->fadexpr_,i);
  dVar4 = sin((this->left_->fadexpr_).expr_.fadexpr_.left_.constant_ *
              ((this->left_->fadexpr_).expr_.fadexpr_.right_)->val_);
  return dVar4 * vVar3 + dVar2 * vVar1;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}